

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O2

Vec_Ptr_t * Vec_PtrStart(int nSize)

{
  Vec_Ptr_t *pVVar1;
  
  pVVar1 = Vec_PtrAlloc(nSize);
  pVVar1->nSize = nSize;
  memset(pVVar1->pArray,0,(long)nSize << 3);
  return pVVar1;
}

Assistant:

static inline Vec_Ptr_t * Vec_PtrStart( int nSize )
{
    Vec_Ptr_t * p;
    p = Vec_PtrAlloc( nSize );
    p->nSize = nSize;
    memset( p->pArray, 0, sizeof(void *) * nSize );
    return p;
}